

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O0

void Abc_NtkReverseTopoOrderTest(Abc_Ntk_t *p)

{
  int iVar1;
  abctime aVar2;
  abctime aVar3;
  Vec_Int_t *p_00;
  Abc_Obj_t *pObj_00;
  abctime clk;
  int i;
  Abc_Obj_t *pObj;
  Vec_Int_t *vVisited;
  Abc_Ntk_t *p_local;
  
  aVar2 = Abc_Clock();
  Abc_NtkReverseTopoOrder(p);
  Vec_IntFreeP(&p->vTopo);
  aVar3 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar3 - aVar2);
  aVar2 = Abc_Clock();
  p_00 = Vec_IntAlloc(1000);
  for (clk._4_4_ = 0; iVar1 = Vec_PtrSize(p->vObjs), clk._4_4_ < iVar1; clk._4_4_ = clk._4_4_ + 1) {
    pObj_00 = Abc_NtkObj(p,clk._4_4_);
    if ((pObj_00 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pObj_00), iVar1 != 0)) {
      Vec_IntClear(p_00);
      Abc_NtkIncrementTravId(p);
      Abc_NtkReverse_rec(pObj_00,p_00);
    }
  }
  Vec_IntFree(p_00);
  aVar3 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar3 - aVar2);
  return;
}

Assistant:

void Abc_NtkReverseTopoOrderTest( Abc_Ntk_t * p )
{
    Vec_Int_t * vVisited;
    Abc_Obj_t * pObj;
    int i;//, k, iBeg, iEnd;
    abctime clk = Abc_Clock();
    Abc_NtkReverseTopoOrder( p );
/*
    printf( "Reverse topological order for nodes:\n" );
    Abc_NtkForEachNode( p, pObj, i )
    {
        iBeg = Abc_NtkTopoHasBeg( pObj );
        iEnd = Abc_NtkTopoHasEnd( pObj );
        printf( "Node %4d : ", Abc_ObjId(pObj) );
        for ( k = iEnd - 1; k >= iBeg; k-- )
            printf( "%d ", Vec_IntEntry(p->vTopo, k) );
        printf( "\n" );
    }
*/
    Vec_IntFreeP( &p->vTopo );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    // compute regular fanout orders
    clk = Abc_Clock();
    vVisited = Vec_IntAlloc( 1000 );
    Abc_NtkForEachNode( p, pObj, i )
    {
        Vec_IntClear( vVisited );
        Abc_NtkIncrementTravId( p ); 
        Abc_NtkReverse_rec( pObj, vVisited );
    }
    Vec_IntFree( vVisited );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
}